

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<wasm::Type> *
wasm::WATParser::maybeReftype<wasm::WATParser::ParseImplicitTypeDefsCtx>
          (MaybeResult<wasm::Type> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *ctx)

{
  Lexer *this;
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
  *p_Var4;
  HeapType HVar5;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string_view expected_13;
  string_view expected_14;
  string_view expected_15;
  undefined1 local_c0 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT> type;
  long local_88;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT> _val;
  
  this = &ctx->in;
  expected._M_str = "funcref";
  expected._M_len = 7;
  bVar2 = Lexer::takeKeyword(this,expected);
  if (bVar2) {
    HVar5.id = 0x10;
  }
  else {
    expected_00._M_str = "externref";
    expected_00._M_len = 9;
    bVar2 = Lexer::takeKeyword(this,expected_00);
    if (bVar2) {
      HVar5.id = 8;
    }
    else {
      expected_01._M_str = "anyref";
      expected_01._M_len = 6;
      bVar2 = Lexer::takeKeyword(this,expected_01);
      if (bVar2) {
        HVar5.id = 0x20;
      }
      else {
        expected_02._M_str = "eqref";
        expected_02._M_len = 5;
        bVar2 = Lexer::takeKeyword(this,expected_02);
        if (bVar2) {
          HVar5.id = 0x28;
        }
        else {
          expected_03._M_str = "i31ref";
          expected_03._M_len = 6;
          bVar2 = Lexer::takeKeyword(this,expected_03);
          if (bVar2) {
            HVar5.id = 0x30;
          }
          else {
            expected_04._M_str = "structref";
            expected_04._M_len = 9;
            bVar2 = Lexer::takeKeyword(this,expected_04);
            if (bVar2) {
              HVar5.id = 0x38;
            }
            else {
              expected_05._M_str = "arrayref";
              expected_05._M_len = 8;
              bVar2 = Lexer::takeKeyword(this,expected_05);
              if (bVar2) {
                HVar5.id = 0x40;
              }
              else {
                expected_06._M_str = "exnref";
                expected_06._M_len = 6;
                bVar2 = Lexer::takeKeyword(this,expected_06);
                if (bVar2) {
                  HVar5.id = 0x48;
                }
                else {
                  expected_07._M_str = "stringref";
                  expected_07._M_len = 9;
                  bVar2 = Lexer::takeKeyword(this,expected_07);
                  if (bVar2) {
                    HVar5.id = 0x50;
                  }
                  else {
                    expected_08._M_str = "contref";
                    expected_08._M_len = 7;
                    bVar2 = Lexer::takeKeyword(this,expected_08);
                    if (bVar2) {
                      HVar5.id = 0x18;
                    }
                    else {
                      expected_09._M_str = "nullref";
                      expected_09._M_len = 7;
                      bVar2 = Lexer::takeKeyword(this,expected_09);
                      if (bVar2) {
                        HVar5.id = 0x58;
                      }
                      else {
                        expected_10._M_str = "nullexternref";
                        expected_10._M_len = 0xd;
                        bVar2 = Lexer::takeKeyword(this,expected_10);
                        if (bVar2) {
                          HVar5.id = 0x60;
                        }
                        else {
                          expected_11._M_str = "nullfuncref";
                          expected_11._M_len = 0xb;
                          bVar2 = Lexer::takeKeyword(this,expected_11);
                          if (bVar2) {
                            HVar5.id = 0x68;
                          }
                          else {
                            expected_12._M_str = "nullexnref";
                            expected_12._M_len = 10;
                            bVar2 = Lexer::takeKeyword(this,expected_12);
                            if (bVar2) {
                              HVar5.id = 0x78;
                            }
                            else {
                              expected_13._M_str = "nullcontref";
                              expected_13._M_len = 0xb;
                              bVar2 = Lexer::takeKeyword(this,expected_13);
                              if (!bVar2) {
                                expected_14._M_str = "ref";
                                expected_14._M_len = 3;
                                bVar2 = Lexer::takeSExprStart(this,expected_14);
                                if (bVar2) {
                                  expected_15._M_str = "null";
                                  expected_15._M_len = 4;
                                  bVar2 = Lexer::takeKeyword(this,expected_15);
                                  heaptype<wasm::WATParser::ParseImplicitTypeDefsCtx>
                                            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
                                              *)local_c0,ctx);
                                  std::__detail::__variant::
                                  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                  ::_Copy_ctor_base((
                                                  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_58,
                                                  (
                                                  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_c0);
                                  if (_val.val.
                                      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      ._M_u._24_1_ == '\x01') {
                                    local_78 = &local_68;
                                    std::__cxx11::string::_M_construct<char*>
                                              ((string *)&local_78,local_58,
                                               (undefined1 *)
                                               ((long)_val.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  ._M_u._M_first._M_storage.type.id + (long)local_58
                                               ));
                                    puVar1 = (undefined8 *)
                                             ((long)&(__return_storage_ptr__->val).
                                                                                                          
                                                  super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                             + 0x10);
                                    *(undefined8 **)
                                     &(__return_storage_ptr__->val).
                                      super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                         = puVar1;
                                    if (local_78 == &local_68) {
                                      *puVar1 = CONCAT71(uStack_67,local_68);
                                      *(undefined8 *)
                                       ((long)&(__return_storage_ptr__->val).
                                               super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                       + 0x18) = uStack_60;
                                    }
                                    else {
                                      *(undefined1 **)
                                       &(__return_storage_ptr__->val).
                                        super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                           = local_78;
                                      *(ulong *)((long)&(__return_storage_ptr__->val).
                                                                                                                
                                                  super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                + 0x10) = CONCAT71(uStack_67,local_68);
                                    }
                                    *(undefined8 *)
                                     ((long)&(__return_storage_ptr__->val).
                                             super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                             .
                                             super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                     + 8) = local_70;
                                    local_70 = 0;
                                    local_68 = 0;
                                    *(__index_type *)
                                     ((long)&(__return_storage_ptr__->val).
                                             super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                             .
                                             super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                     + 0x20) = '\x02';
                                    local_78 = &local_68;
                                    std::__detail::__variant::
                                    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                    ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_58);
                                  }
                                  else {
                                    std::__detail::__variant::
                                    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                    ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_58);
                                    bVar3 = Lexer::takeRParen(this);
                                    if (bVar3) {
                                      p_Var4 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                *)0x0;
                                      if (type.val.
                                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          ._M_u._24_1_ == '\0') {
                                        p_Var4 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_c0;
                                      }
                                      wasm::Type::Type((Type *)local_58,(HeapType)local_c0,
                                                       (uint)bVar2,
                                                       *(Exactness *)
                                                        ((long)&(p_Var4->
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  )._M_u + 8));
                                      *(undefined1 (*) [8])
                                       &(__return_storage_ptr__->val).
                                        super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                           = local_58;
                                      *(__index_type *)
                                       ((long)&(__return_storage_ptr__->val).
                                               super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                       + 0x20) = '\0';
                                    }
                                    else {
                                      type.val.
                                      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      ._32_8_ = &stack0xffffffffffffff78;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)
                                                 ((long)&type.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                 + 0x20),"expected end of reftype","");
                                      Lexer::err((Err *)local_58,this,
                                                 (string *)
                                                 ((long)&type.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                 + 0x20));
                                      puVar1 = (undefined8 *)
                                               ((long)&(__return_storage_ptr__->val).
                                                                                                              
                                                  super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               + 0x10);
                                      *(undefined8 **)
                                       &(__return_storage_ptr__->val).
                                        super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                           = puVar1;
                                      HVar5.id = (long)&_val.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                 + 8;
                                      if (local_58 == (undefined1  [8])HVar5.id) {
                                        *puVar1 = CONCAT71(_val.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  ._M_u._9_7_,
                                                  _val.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  ._M_u._M_first._M_storage.exactness._0_1_);
                                        *(undefined8 *)
                                         ((long)&(__return_storage_ptr__->val).
                                                 super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                 .
                                                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                         + 0x18) = _val.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  ._M_u._16_8_;
                                      }
                                      else {
                                        *(undefined1 (*) [8])
                                         &(__return_storage_ptr__->val).
                                          super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                          .super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                          .super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                          .
                                          super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                             = local_58;
                                        *(ulong *)((long)&(__return_storage_ptr__->val).
                                                                                                                    
                                                  super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                                  + 0x10) =
                                             CONCAT71(_val.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  ._M_u._9_7_,
                                                  _val.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  ._M_u._M_first._M_storage.exactness._0_1_);
                                      }
                                      ((HeapType *)
                                      ((long)&(__return_storage_ptr__->val).
                                              super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                              .
                                              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                              .
                                              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                              .
                                              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                              .
                                              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                      + 8))->id = (uintptr_t)
                                                  _val.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  ._M_u._M_first._M_storage.type.id;
                                      _val.val.
                                      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      ._M_u._M_first._M_storage.type.id = (HeapType)0;
                                      _val.val.
                                      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                      ._M_u._M_first._M_storage.exactness._0_1_ = 0;
                                      *(__index_type *)
                                       ((long)&(__return_storage_ptr__->val).
                                               super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                       + 0x20) = '\x02';
                                      local_58 = (undefined1  [8])HVar5;
                                      if ((long *)type.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  ._32_8_ != &stack0xffffffffffffff78) {
                                        operator_delete((void *)type.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  ._32_8_,local_88 + 1);
                                      }
                                    }
                                  }
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_c0);
                                  return __return_storage_ptr__;
                                }
                                *(__index_type *)
                                 ((long)&(__return_storage_ptr__->val).
                                         super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                         .super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                         super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                 + 0x20) = '\x01';
                                return __return_storage_ptr__;
                              }
                              HVar5.id = 0x70;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  wasm::Type::Type((Type *)__return_storage_ptr__,HVar5,Nullable,Inexact);
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::TypeT> maybeReftype(Ctx& ctx) {
  if (ctx.in.takeKeyword("funcref"sv)) {
    return ctx.makeRefType(ctx.makeFuncType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("externref"sv)) {
    return ctx.makeRefType(ctx.makeExternType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("anyref"sv)) {
    return ctx.makeRefType(ctx.makeAnyType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("eqref"sv)) {
    return ctx.makeRefType(ctx.makeEqType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("i31ref"sv)) {
    return ctx.makeRefType(ctx.makeI31Type(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("structref"sv)) {
    return ctx.makeRefType(ctx.makeStructType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("arrayref"sv)) {
    return ctx.makeRefType(ctx.makeArrayType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("exnref"sv)) {
    return ctx.makeRefType(ctx.makeExnType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("stringref"sv)) {
    return ctx.makeRefType(ctx.makeStringType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("contref"sv)) {
    return ctx.makeRefType(ctx.makeContType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullref"sv)) {
    return ctx.makeRefType(ctx.makeNoneType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullexternref"sv)) {
    return ctx.makeRefType(ctx.makeNoextType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullfuncref"sv)) {
    return ctx.makeRefType(ctx.makeNofuncType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullexnref"sv)) {
    return ctx.makeRefType(ctx.makeNoexnType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullcontref"sv)) {
    return ctx.makeRefType(ctx.makeNocontType(Unshared), Nullable);
  }

  if (!ctx.in.takeSExprStart("ref"sv)) {
    return {};
  }

  auto nullability = ctx.in.takeKeyword("null"sv) ? Nullable : NonNullable;

  auto type = heaptype(ctx);
  CHECK_ERR(type);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of reftype");
  }

  return ctx.makeRefType(*type, nullability);
}